

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall helics::TimeCoordinator::updateNextPossibleEventTime(TimeCoordinator *this)

{
  IterationRequest IVar1;
  long lVar2;
  Time TVar3;
  Time testTime;
  
  IVar1 = this->iterating;
  if (IVar1 == NO_ITERATIONS) {
    TVar3 = getNextPossibleTime(this);
  }
  else {
    TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
  }
  (this->time_next).internalTimeCode = TVar3.internalTimeCode;
  if ((this->info).uninterruptible == true) {
    if (IVar1 == NO_ITERATIONS) {
      TVar3 = generateAllowedTime(this,(this->time_requested).internalTimeCode);
      goto LAB_00350d4a;
    }
    lVar2 = (this->time_minminDe).internalTimeCode;
    if (((lVar2 != 0x7fffffffffffffff) && ((this->info).restrictive_time_policy == false)) &&
       (TVar3.internalTimeCode < lVar2 + (this->info).inputDelay.internalTimeCode)) {
      testTime.internalTimeCode = (this->time_requested).internalTimeCode;
      goto LAB_00350d26;
    }
  }
  else {
    lVar2 = (this->time_minminDe).internalTimeCode;
    if (((lVar2 != 0x7fffffffffffffff) && ((this->info).restrictive_time_policy == false)) &&
       (testTime.internalTimeCode = lVar2 + (this->info).inputDelay.internalTimeCode,
       TVar3.internalTimeCode < testTime.internalTimeCode)) {
      (this->time_next).internalTimeCode = testTime.internalTimeCode;
LAB_00350d26:
      TVar3 = generateAllowedTime(this,testTime);
      (this->time_next).internalTimeCode = TVar3.internalTimeCode;
    }
  }
  TVar3.internalTimeCode = (this->time_next).internalTimeCode;
  lVar2 = (this->time_exec).internalTimeCode;
  if (lVar2 < TVar3.internalTimeCode) {
    TVar3.internalTimeCode = lVar2;
  }
LAB_00350d4a:
  (this->time_next).internalTimeCode =
       TVar3.internalTimeCode + (this->info).outputDelay.internalTimeCode;
  return;
}

Assistant:

void TimeCoordinator::updateNextPossibleEventTime()
{
    time_next =
        (iterating == IterationRequest::NO_ITERATIONS) ? getNextPossibleTime() : time_granted;

    if (info.uninterruptible) {
        if (iterating == IterationRequest::NO_ITERATIONS) {
            time_next = generateAllowedTime(time_requested) + info.outputDelay;
        } else {
            if (time_minminDe < Time::maxVal() && !info.restrictive_time_policy) {
                if (time_minminDe + info.inputDelay > time_next) {
                    time_next = generateAllowedTime(time_requested);
                }
            }
            time_next = std::min(time_next, time_exec) + info.outputDelay;
        }
    } else {
        if (time_minminDe < Time::maxVal() && !info.restrictive_time_policy) {
            if (time_minminDe + info.inputDelay > time_next) {
                time_next = time_minminDe + info.inputDelay;
                time_next = generateAllowedTime(time_next);
            }
        }
        time_next = std::min(time_next, time_exec) + info.outputDelay;
    }
}